

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentiment.cpp
# Opt level: O1

PyObject * PyInit_sentiment(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *__s1;
  class_<KNNClassifier> *this;
  class_<PCA> *this_00;
  module m;
  arg local_f8;
  arg local_e8;
  arg local_d8;
  _func_pair<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_Matrix<double,__1,__1,_1,__1,__1>_ptr_uint_uint_double
  *local_c8;
  double local_c0;
  int local_b4;
  arg_v local_b0;
  arg_v local_70;
  
  __s1 = (char *)Py_GetVersion();
  iVar3 = strncmp(__s1,"3.10",4);
  if ((iVar3 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::module::module(&m,"sentiment",(char *)0x0);
    pybind11::class_<KNNClassifier>::class_<>
              ((class_<KNNClassifier> *)&local_f8,(handle)m.super_object.super_handle.m_ptr,
               "KNNClassifier");
    pybind11::class_<KNNClassifier>::
    def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ilanolkies[P]metnum_tp2_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor>
              ((class_<KNNClassifier> *)&local_f8,"__init__",(type *)&local_70,
               (is_new_style_constructor *)&local_b0);
    local_70.super_arg.name = (char *)KNNClassifier::fit;
    local_70.super_arg._8_8_ = 0;
    this = pybind11::class_<KNNClassifier>::
           def<void(KNNClassifier::*)(Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,_1,1,_1,_1>)>
                     ((class_<KNNClassifier> *)&local_f8,"fit",
                      (offset_in_KNNClassifier_to_subr *)&local_70);
    local_b0.super_arg.name = (char *)KNNClassifier::predict;
    local_b0.super_arg._8_8_ = 0;
    pybind11::class_<KNNClassifier>::
    def<Eigen::Matrix<double,_1,1,0,_1,1>(KNNClassifier::*)(Eigen::SparseMatrix<double,1,int>)>
              (this,"predict",(offset_in_KNNClassifier_to_subr *)&local_b0);
    pybind11::object::~object((object *)&local_f8);
    pybind11::class_<PCA>::class_<>
              ((class_<PCA> *)&local_f8,(handle)m.super_object.super_handle.m_ptr,"PCA");
    pybind11::class_<PCA>::
    def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ilanolkies[P]metnum_tp2_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor>
              ((class_<PCA> *)&local_f8,"__init__",(type *)&local_70,
               (is_new_style_constructor *)&local_b0);
    local_70.super_arg.name = (char *)PCA::fit;
    local_70.super_arg._8_8_ = 0;
    this_00 = pybind11::class_<PCA>::def<void(PCA::*)(Eigen::Matrix<double,_1,_1,1,_1,_1>)>
                        ((class_<PCA> *)&local_f8,"fit",(offset_in_KNNClassifier_to_subr *)&local_70
                        );
    local_b0.super_arg.name = (char *)PCA::transform;
    local_b0.super_arg._8_8_ = 0;
    pybind11::class_<PCA>::
    def<Eigen::Matrix<double,_1,_1,0,_1,_1>(PCA::*)(Eigen::SparseMatrix<double,1,int>)>
              (this_00,"transform",(offset_in_KNNClassifier_to_subr *)&local_b0);
    pybind11::object::~object((object *)&local_f8);
    local_d8.name = (char *)power_iteration;
    local_e8.name = "X";
    local_e8._8_1_ = local_e8._8_1_ & 0xfc | 2;
    local_c0 = (double)CONCAT44(local_c0._4_4_,5000);
    local_b0.super_arg.name = "num_iter";
    local_b0.super_arg._8_1_ = 2;
    pybind11::arg_v::arg_v<int>(&local_70,&local_b0.super_arg,(int *)&local_c0,(char *)0x0);
    local_c8 = (_func_pair<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_Matrix<double,__1,__1,_1,__1,__1>_ptr_uint_uint_double
                *)0x3c9cd2b297d889bc;
    local_f8.name = "epsilon";
    local_f8._8_1_ = 2;
    pybind11::arg_v::arg_v<double>(&local_b0,&local_f8,(double *)&local_c8,(char *)0x0);
    pybind11::module::
    def<std::pair<double,Eigen::Matrix<double,_1,1,0,_1,1>>(*)(Eigen::Matrix<double,_1,_1,1,_1,_1>const&,unsigned_int,double),char[37],pybind11::arg,pybind11::arg_v,pybind11::arg_v>
              (&m,"power_iteration",
               (_func_pair<double,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_Matrix<double,__1,__1,_1,__1,__1>_ptr_uint_double
                **)&local_d8,(char (*) [37])"Function that calculates eigenvector",&local_e8,
               &local_70,&local_b0);
    paVar1 = &local_b0.type.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.type._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.type._M_dataplus._M_p);
    }
    pybind11::object::~object(&local_b0.value);
    paVar2 = &local_70.type.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.type._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.type._M_dataplus._M_p);
    }
    pybind11::object::~object(&local_70.value);
    local_c8 = get_first_eigenvalues;
    local_e8.name = "X";
    local_e8._8_1_ = local_e8._8_1_ & 0xfc | 2;
    local_d8.name = "num";
    local_d8._8_1_ = local_d8._8_1_ & 0xfc | 2;
    local_b4 = 5000;
    local_b0.super_arg.name = "num_iter";
    local_b0.super_arg._8_1_ = 2;
    pybind11::arg_v::arg_v<int>(&local_70,&local_b0.super_arg,&local_b4,(char *)0x0);
    local_c0 = 1e-16;
    local_f8.name = "epsilon";
    local_f8._8_1_ = 2;
    pybind11::arg_v::arg_v<double>(&local_b0,&local_f8,&local_c0,(char *)0x0);
    pybind11::module::
    def<std::pair<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(*)(Eigen::Matrix<double,_1,_1,1,_1,_1>const&,unsigned_int,unsigned_int,double),char[37],pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v>
              (&m,"get_first_eigenvalues",&local_c8,
               (char (*) [37])"Function that calculates eigenvector",&local_e8,&local_d8,&local_70,
               &local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.type._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.type._M_dataplus._M_p);
    }
    pybind11::object::~object(&local_b0.value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.type._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.type._M_dataplus._M_p);
    }
    pybind11::object::~object(&local_70.value);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(sentiment, m) {
    py::class_<KNNClassifier>(m, "KNNClassifier")
        .def(py::init<unsigned int>())
        .def("fit", &KNNClassifier::fit)
        .def("predict", &KNNClassifier::predict);

    py::class_<PCA>(m, "PCA")
        .def(py::init<unsigned int>())
        .def("fit", &PCA::fit)
        .def("transform", &PCA::transform);
    m.def(
        "power_iteration", &power_iteration,
        "Function that calculates eigenvector",
        py::arg("X"),
        py::arg("num_iter")=5000,
        py::arg("epsilon")=1e-16
    );
    m.def(
        "get_first_eigenvalues", &get_first_eigenvalues,
        "Function that calculates eigenvector",
        py::arg("X"),
        py::arg("num"),
        py::arg("num_iter")=5000,
        py::arg("epsilon")=1e-16
    );

}